

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall
cmFindCommon::RerootPaths
          (cmFindCommon *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  cmMakefile *pcVar1;
  undefined8 l;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  reference r_00;
  string *psVar6;
  ulong uVar7;
  char *pcVar8;
  char local_231;
  string local_230;
  char *local_210;
  char *split;
  string rootedDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *up;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r_1;
  iterator __end1_1;
  iterator __begin1_1;
  cmList *__range1_1;
  undefined1 local_1a0 [7];
  anon_class_1_0_00000001 isSameDirectoryOrSubDirectory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrootedPaths;
  string local_180;
  cmValue local_160;
  cmValue stagePrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  cmList roots;
  bool noRootPath;
  bool noLinkSysroot;
  bool noCompileSysroot;
  allocator<char> local_e1;
  undefined1 local_e0 [6];
  bool noSysroot;
  cmValue local_c0;
  cmValue rootPath;
  string local_b0;
  cmValue local_90;
  cmValue sysrootLink;
  string local_80;
  cmValue local_60;
  cmValue sysrootCompile;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue sysroot;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmFindCommon *this_local;
  
  if (this->FindRootPathMode != RootPathModeNever) {
    pcVar1 = this->Makefile;
    sysroot.Value = (string *)paths;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CMAKE_SYSROOT",&local_41);
    local_20 = cmMakefile::GetDefinition(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_SYSROOT_COMPILE",
               (allocator<char> *)((long)&sysrootLink.Value + 7));
    local_60 = cmMakefile::GetDefinition(pcVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysrootLink.Value + 7));
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_SYSROOT_LINK",
               (allocator<char> *)((long)&rootPath.Value + 7));
    local_90 = cmMakefile::GetDefinition(pcVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rootPath.Value + 7));
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,"CMAKE_FIND_ROOT_PATH",&local_e1);
    local_c0 = cmMakefile::GetDefinition(pcVar1,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::allocator<char>::~allocator(&local_e1);
    bVar2 = cmNonempty(local_20);
    bVar3 = cmNonempty(local_60);
    bVar4 = cmNonempty(local_90);
    roots.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_c0.Value;
    bVar5 = cmNonempty(local_c0);
    if ((((((bVar2 ^ 0xffU) & 1) == 0) || (((bVar3 ^ 0xffU) & 1) == 0)) ||
        (((bVar4 ^ 0xffU) & 1) == 0)) || (((bVar5 ^ 0xffU) & 1) == 0)) {
      cmList::cmList((cmList *)&__range1);
      bVar2 = cmValue::operator_cast_to_bool(&local_c0);
      if (bVar2) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_c0);
        cmList::assign((cmList *)&__range1,psVar6,Yes,No);
      }
      bVar2 = cmValue::operator_cast_to_bool(&local_60);
      if (bVar2) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_60);
        cmList::emplace_back<std::__cxx11::string_const&>((cmList *)&__range1,psVar6);
      }
      bVar2 = cmValue::operator_cast_to_bool(&local_90);
      if (bVar2) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_90);
        cmList::emplace_back<std::__cxx11::string_const&>((cmList *)&__range1,psVar6);
      }
      bVar2 = cmValue::operator_cast_to_bool(&local_20);
      if (bVar2) {
        psVar6 = cmValue::operator*[abi_cxx11_(&local_20);
        cmList::emplace_back<std::__cxx11::string_const&>((cmList *)&__range1,psVar6);
      }
      __end1 = cmList::begin_abi_cxx11_((cmList *)&__range1);
      r = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          cmList::end_abi_cxx11_((cmList *)&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&r), bVar2) {
        stagePrefix.Value =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        cmsys::SystemTools::ConvertToUnixSlashes(stagePrefix.Value);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"CMAKE_STAGING_PREFIX",
                 (allocator<char> *)
                 ((long)&unrootedPaths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_160 = cmMakefile::GetDefinition(pcVar1,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&unrootedPaths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)sysroot.Value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)sysroot.Value);
      __end1_1 = cmList::begin_abi_cxx11_((cmList *)&__range1);
      r_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            cmList::end_abi_cxx11_((cmList *)&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&r_1), bVar2) {
        r_00 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1a0);
        up = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&up), bVar2) {
          rootedDir.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
          std::__cxx11::string::string((string *)&split);
          bVar2 = RerootPaths::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&__range1_1 + 7),
                             (string *)rootedDir.field_2._8_8_,r_00);
          if (bVar2) {
LAB_009a6244:
            std::__cxx11::string::operator=((string *)&split,(string *)rootedDir.field_2._8_8_);
          }
          else {
            bVar2 = cmValue::operator_cast_to_bool(&local_160);
            l = rootedDir.field_2._8_8_;
            if (bVar2) {
              psVar6 = cmValue::operator*[abi_cxx11_(&local_160);
              bVar2 = RerootPaths::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)((long)&__range1_1 + 7),(string *)l,
                                 psVar6);
              if (bVar2) goto LAB_009a6244;
            }
            uVar7 = std::__cxx11::string::empty();
            if (((uVar7 & 1) == 0) &&
               (pcVar8 = (char *)std::__cxx11::string::operator[](rootedDir.field_2._8_8_),
               *pcVar8 != '~')) {
              local_210 = cmsys::SystemTools::SplitPathRootComponent
                                    ((string *)rootedDir.field_2._8_8_,(string *)0x0);
              if ((local_210 == (char *)0x0) || (*local_210 == '\0')) {
                std::__cxx11::string::operator=((string *)&split,(string *)r_00);
              }
              else {
                local_231 = '/';
                cmStrCat<std::__cxx11::string_const&,char,char_const*&>
                          (&local_230,r_00,&local_231,&local_210);
                std::__cxx11::string::operator=((string *)&split,(string *)&local_230);
                std::__cxx11::string::~string((string *)&local_230);
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)sysroot.Value,(value_type *)&split);
          std::__cxx11::string::~string((string *)&split);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      if (this->FindRootPathMode == RootPathModeBoth) {
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)sysroot.Value,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0);
      cmList::~cmList((cmList *)&__range1);
    }
  }
  return;
}

Assistant:

void cmFindCommon::RerootPaths(std::vector<std::string>& paths)
{
#if 0
  for(std::string const& p : paths)
    {
    fprintf(stderr, "[%s]\n", p.c_str());
    }
#endif
  // Short-circuit if there is nothing to do.
  if (this->FindRootPathMode == RootPathModeNever) {
    return;
  }

  cmValue sysroot = this->Makefile->GetDefinition("CMAKE_SYSROOT");
  cmValue sysrootCompile =
    this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE");
  cmValue sysrootLink = this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK");
  cmValue rootPath = this->Makefile->GetDefinition("CMAKE_FIND_ROOT_PATH");
  const bool noSysroot = !cmNonempty(sysroot);
  const bool noCompileSysroot = !cmNonempty(sysrootCompile);
  const bool noLinkSysroot = !cmNonempty(sysrootLink);
  const bool noRootPath = !cmNonempty(rootPath);
  if (noSysroot && noCompileSysroot && noLinkSysroot && noRootPath) {
    return;
  }

  // Construct the list of path roots with no trailing slashes.
  cmList roots;
  if (rootPath) {
    roots.assign(*rootPath);
  }
  if (sysrootCompile) {
    roots.emplace_back(*sysrootCompile);
  }
  if (sysrootLink) {
    roots.emplace_back(*sysrootLink);
  }
  if (sysroot) {
    roots.emplace_back(*sysroot);
  }
  for (auto& r : roots) {
    cmSystemTools::ConvertToUnixSlashes(r);
  }

  cmValue stagePrefix = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");

  // Copy the original set of unrooted paths.
  auto unrootedPaths = paths;
  paths.clear();

  auto isSameDirectoryOrSubDirectory = [](std::string const& l,
                                          std::string const& r) {
    return (cmSystemTools::GetRealPath(l) == cmSystemTools::GetRealPath(r)) ||
      cmSystemTools::IsSubDirectory(l, r);
  };

  for (auto const& r : roots) {
    for (auto const& up : unrootedPaths) {
      // Place the unrooted path under the current root if it is not
      // already inside.  Skip the unrooted path if it is relative to
      // a user home directory or is empty.
      std::string rootedDir;
      if (isSameDirectoryOrSubDirectory(up, r) ||
          (stagePrefix && isSameDirectoryOrSubDirectory(up, *stagePrefix))) {
        rootedDir = up;
      } else if (!up.empty() && up[0] != '~') {
        auto const* split = cmSystemTools::SplitPathRootComponent(up);
        if (split && *split) {
          // Start with the new root.
          rootedDir = cmStrCat(r, '/', split);
        } else {
          rootedDir = r;
        }
      }

      // Store the new path.
      paths.push_back(rootedDir);
    }
  }

  // If searching both rooted and unrooted paths add the original
  // paths again.
  if (this->FindRootPathMode == RootPathModeBoth) {
    cm::append(paths, unrootedPaths);
  }
}